

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cxx17_string_view.cpp
# Opt level: O3

void __thiscall
iu_StringViewSplit_x_iutest_x_chain_front_by_stl_str_view_Test<char>::Body
          (iu_StringViewSplit_x_iutest_x_chain_front_by_stl_str_view_Test<char> *this)

{
  basic_string_view<char,_std::char_traits<char>_> *in_R9;
  AssertionResult iutest_ar;
  basic_string_view<char,_std::char_traits<char>_> s;
  char *local_208;
  AssertionResult local_200;
  basic_string_view<char,_std::char_traits<char>_> local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  char *local_1b8;
  undefined8 local_1b0;
  basic_string_view<char,_std::char_traits<char>_> local_1a8;
  undefined1 local_198 [16];
  size_t local_188;
  ios_base local_118 [264];
  
  local_1a8._M_len = 0x13;
  local_1a8._M_str = "arikitari na_world!";
  local_208 = "arikitari";
  local_198._0_8_ = 2;
  local_198._8_8_ = "_ ";
  local_188 = 0;
  local_1d8 = detail::
              operator|<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_false,_false,_nullptr>
                        (&local_1a8,
                         (split_helper_index<std::basic_string_view<char,_std::char_traits<char>_>,_false,_false,_false>
                          *)local_198);
  iutest::internal::CmpHelperEQ<char_const*,std::basic_string_view<char,std::char_traits<char>>>
            (&local_200,(internal *)"constant::arikitari<char_type>()","s | split(delim) >> front()"
             ,(char *)&local_208,(char **)&local_1d8,in_R9);
  if (local_200.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,local_200.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_208);
    local_1b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_cxx17_string_view.cpp"
    ;
    local_1b0 = 0x20000002b;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_1d8,(Fixed *)local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_len != &local_1c8) {
      operator_delete((void *)local_1d8._M_len,local_1c8._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base(local_118);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.m_message._M_dataplus._M_p != &local_200.m_message.field_2) {
    operator_delete(local_200.m_message._M_dataplus._M_p,
                    local_200.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringViewSplit, chain_front_by_stl_str_view)
{
	using char_type = TypeParam;
	const std::basic_string_view<char_type> s = constant::arikitari_na_world_underscore<char_type>();
	const std::basic_string_view<char_type> delim = constant::space_underscore<char_type>();
	IUTEST_ASSERT_EQ(constant::arikitari<char_type>(), s | split(delim) >> front());
}